

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O3

void __thiscall ot::commissioner::JoinerSession::Connect(JoinerSession *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  ErrorCode EVar1;
  pointer puVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  Error error;
  allocator_type local_129;
  undefined1 local_128 [8];
  _Alloc_hider _Stack_120;
  pointer local_118;
  char local_110 [16];
  ErrorCode local_100;
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  char local_a0 [16];
  DtlsConfig local_90;
  
  local_100 = 0;
  local_f0 = 0;
  local_e8[0] = 0;
  local_f8 = local_e8;
  iVar3 = (*(this->mCommImpl->super_Commissioner)._vptr_Commissioner[3])();
  GetDtlsConfig(&local_90,(Config *)CONCAT44(extraout_var,iVar3));
  __first._M_current = (this->mJoinerPSKd)._M_dataplus._M_p;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_128,__first,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + (this->mJoinerPSKd)._M_string_length),&local_129);
  puVar2 = local_90.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_90.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_128;
  local_90.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)_Stack_120._M_p;
  local_90.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_118;
  local_128 = (undefined1  [8])0x0;
  _Stack_120._M_p = (char *)0x0;
  local_118 = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    if (local_128 != (undefined1  [8])0x0) {
      operator_delete((void *)local_128);
    }
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->mExpirationTime).__d.__r = lVar4 + 80000000000;
  DtlsSession::Init((Error *)local_128,
                    (this->mDtlsSession).
                    super___shared_ptr<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,&local_90);
  local_100 = local_128._0_4_;
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&_Stack_120);
  EVar1 = local_100;
  if (_Stack_120._M_p != local_110) {
    operator_delete(_Stack_120._M_p);
  }
  if (EVar1 == kNone) {
    local_d8._8_8_ = 0;
    local_c0 = std::
               _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/joiner_session.cpp:100:28)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/joiner_session.cpp:100:28)>
               ::_M_manager;
    local_d8._M_unused._M_object = this;
    DtlsSession::Connect
              ((this->mDtlsSession).
               super___shared_ptr<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (ConnectHandler *)&local_d8);
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
  }
  if (local_100 != kNone) {
    local_b8._0_4_ = local_100;
    local_b0._M_p = local_a0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_f8,local_f8 + local_f0);
    HandleConnect(this,(Error *)local_b8);
    if (local_b0._M_p != local_a0) {
      operator_delete(local_b0._M_p);
    }
  }
  if (local_90.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.mCaChain.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.mOwnCert.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.mOwnKey.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  return;
}

Assistant:

void JoinerSession::Connect()
{
    Error error;

    auto dtlsConfig = GetDtlsConfig(mCommImpl.GetConfig());
    dtlsConfig.mPSK = {mJoinerPSKd.begin(), mJoinerPSKd.end()};

    mExpirationTime = Clock::now() + MilliSeconds(kDtlsHandshakeTimeoutMax * 1000 + kJoinerTimeout * 1000);

    SuccessOrExit(error = mDtlsSession->Init(dtlsConfig));

    {
        auto onConnected = [this](const DtlsSession &, Error aError) { HandleConnect(aError); };
        mDtlsSession->Connect(onConnected);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        HandleConnect(error);
    }
}